

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::CodePointToUtf8_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,uint32_t code_point)

{
  uint32_t uVar1;
  allocator<char> local_6a;
  byte local_69;
  byte local_68;
  byte local_67;
  byte local_66;
  undefined1 local_65;
  char str [5];
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  uint local_14;
  string *psStack_10;
  uint32_t code_point_local;
  
  local_14 = (uint)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 < 0x200000) {
    if (local_14 < 0x80) {
      local_68 = 0;
      local_69 = (byte)this;
    }
    else {
      if (local_14 < 0x800) {
        local_67 = 0;
        uVar1 = ChopLowBits(&local_14,6);
        local_68 = (byte)uVar1;
        local_69 = (byte)local_14 | 0xc0;
      }
      else if (local_14 < 0x10000) {
        local_66 = 0;
        uVar1 = ChopLowBits(&local_14,6);
        local_67 = (byte)uVar1 | 0x80;
        uVar1 = ChopLowBits(&local_14,6);
        local_68 = (byte)uVar1;
        local_69 = (byte)local_14 | 0xe0;
      }
      else {
        local_65 = 0;
        uVar1 = ChopLowBits(&local_14,6);
        local_66 = (byte)uVar1 | 0x80;
        uVar1 = ChopLowBits(&local_14,6);
        local_67 = (byte)uVar1 | 0x80;
        uVar1 = ChopLowBits(&local_14,6);
        local_68 = (byte)uVar1;
        local_69 = (byte)local_14 | 0xf0;
      }
      local_68 = local_68 | 0x80;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)&local_69,&local_6a);
    std::allocator<char>::~allocator(&local_6a);
  }
  else {
    String::FormatHexUInt32_abi_cxx11_(&local_58,(String *)((ulong)this & 0xffffffff),code_point);
    std::operator+(&local_38,"(Invalid Unicode 0x",&local_58);
    std::operator+(__return_storage_ptr__,&local_38,")");
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CodePointToUtf8(uint32_t code_point) {
  if (code_point > kMaxCodePoint4) {
    return "(Invalid Unicode 0x" + String::FormatHexUInt32(code_point) + ")";
  }

  char str[5];  // Big enough for the largest valid code point.
  if (code_point <= kMaxCodePoint1) {
    str[1] = '\0';
    str[0] = static_cast<char>(code_point);                          // 0xxxxxxx
  } else if (code_point <= kMaxCodePoint2) {
    str[2] = '\0';
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xC0 | code_point);                   // 110xxxxx
  } else if (code_point <= kMaxCodePoint3) {
    str[3] = '\0';
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xE0 | code_point);                   // 1110xxxx
  } else {  // code_point <= kMaxCodePoint4
    str[4] = '\0';
    str[3] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xF0 | code_point);                   // 11110xxx
  }
  return str;
}